

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sastoken.c
# Opt level: O1

_Bool SASToken_Validate(STRING_HANDLE sasToken)

{
  long lVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  char *__s;
  LOGGER_LOG p_Var6;
  time_t stopTime;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  size_t __size;
  uint uVar17;
  uint uVar18;
  size_t __n;
  bool bVar19;
  double dVar20;
  double dVar21;
  
  pcVar4 = STRING_c_str(sasToken);
  if (pcVar4 != (char *)0x0 && sasToken != (STRING_HANDLE)0x0) {
    sVar5 = STRING_length(sasToken);
    uVar3 = (uint)sVar5;
    if ((int)uVar3 < 1) {
      iVar7 = -1;
      uVar8 = 0xffffffff;
      uVar10 = 0xffffffff;
      uVar18 = 0xffffffff;
      uVar16 = 0xffffffff;
      uVar17 = 0xffffffff;
    }
    else {
      lVar13 = 3;
      uVar14 = 0xfffffffe;
      iVar15 = 0;
      uVar17 = 0xffffffff;
      uVar16 = 0xffffffff;
      uVar18 = 0xffffffff;
      uVar10 = 0xffffffff;
      uVar8 = 0xffffffff;
      iVar7 = -1;
      do {
        if (pcVar4[lVar13 + -3] == 's') {
          uVar12 = (uint)lVar13;
          if ((pcVar4[lVar13 + -2] == 'e') && (pcVar4[lVar13 + -1] == '=')) {
            uVar17 = uVar12;
            if (((int)uVar18 < 1) || (-1 < (int)uVar10)) {
              if ((0 < iVar7) && ((int)uVar8 < 0)) {
                if (pcVar4[lVar13 + -4] != ' ') {
                  bVar19 = pcVar4[lVar13 + -4] == '&';
                  if (bVar19) {
                    uVar8 = uVar14;
                  }
                  goto LAB_00130bd4;
                }
                uVar8 = iVar15 - 1;
              }
            }
            else if (pcVar4[lVar13 + -4] == ' ') {
              uVar10 = iVar15 - 1;
            }
            else {
              bVar19 = pcVar4[lVar13 + -4] == '&';
              if (bVar19) {
                uVar10 = uVar14;
              }
LAB_00130bd4:
              uVar17 = 0xffffffff;
              if (bVar19) {
                uVar17 = uVar12;
              }
            }
          }
          else if ((pcVar4[lVar13 + -2] == 'r') && (pcVar4[lVar13 + -1] == '=')) {
            uVar18 = uVar12;
            if (((int)uVar17 < 1) || (-1 < (int)uVar16)) {
              if ((0 < iVar7) && ((int)uVar8 < 0)) {
                cVar2 = pcVar4[lVar13 + -4];
                if (cVar2 == ' ') {
                  uVar8 = uVar14 + 1;
                }
                else {
                  if (cVar2 == '&') {
                    uVar8 = uVar14;
                  }
                  uVar18 = 0xffffffff;
                  if (cVar2 == '&') {
                    uVar18 = uVar12;
                  }
                }
              }
            }
            else if (pcVar4[lVar13 + -4] == ' ') {
              uVar16 = iVar15 - 1;
            }
            else {
              bVar19 = pcVar4[lVar13 + -4] == '&';
              uVar18 = 0xffffffff;
              if (bVar19) {
                uVar18 = uVar12;
              }
LAB_00130bee:
              if (bVar19) {
                uVar16 = uVar14;
              }
            }
          }
          else if (((pcVar4[lVar13 + -2] == 'i') && (pcVar4[lVar13 + -1] == 'g')) &&
                  (pcVar4[lVar13] == '=')) {
            iVar7 = uVar14 + 6;
            if (((int)uVar18 < 1) || (-1 < (int)uVar10)) {
              if ((0 < (int)uVar17) && ((int)uVar16 < 0)) {
                if (pcVar4[lVar13 + -4] != ' ') {
                  bVar19 = pcVar4[lVar13 + -4] == '&';
                  iVar7 = uVar14 + 6;
                  if (!bVar19) {
                    iVar7 = -1;
                  }
                  goto LAB_00130bee;
                }
                uVar16 = uVar14 + 1;
              }
            }
            else if (pcVar4[lVar13 + -4] == ' ') {
              uVar10 = uVar14 + 1;
            }
            else {
              iVar7 = -1;
              if (pcVar4[lVar13 + -4] == '&') {
                iVar7 = uVar14 + 6;
                uVar10 = uVar14;
              }
            }
          }
        }
        iVar15 = iVar15 + 1;
        uVar14 = uVar14 + 1;
        lVar1 = lVar13 - (ulong)(uVar3 & 0x7fffffff);
        lVar13 = lVar13 + 1;
      } while (lVar1 != 2);
    }
    if ((int)uVar17 < 0) {
      return false;
    }
    if ((int)uVar18 < 0) {
      return false;
    }
    if (iVar7 < 0) {
      return false;
    }
    uVar14 = uVar3;
    uVar12 = uVar8;
    uVar11 = uVar10;
    if (((-1 < (int)uVar16) && (uVar14 = uVar16, uVar11 = uVar3, -1 < (int)uVar10)) &&
       (uVar12 = uVar3, uVar11 = uVar10, -1 < (int)uVar8)) {
      uVar12 = uVar8;
    }
    if ((int)uVar14 <= (int)uVar17) {
      return false;
    }
    if ((int)uVar11 <= (int)uVar18) {
      return false;
    }
    if ((int)uVar12 <= iVar7) {
      return false;
    }
    uVar9 = (ulong)uVar17;
    __n = (uVar14 - uVar9) + 1;
    __size = __n;
    if (__n == 0) {
      __size = 0xffffffffffffffff;
    }
    if (uVar14 < uVar17) {
      __size = 0xffffffffffffffff;
    }
    if ((__size != 0xffffffffffffffff) && (__s = (char *)malloc(__size), __s != (char *)0x0)) {
      memset(__s,0,__n);
      if ((int)uVar17 < (int)uVar14) {
        lVar13 = 0;
        do {
          if (pcVar4[lVar13 + uVar9] == '&') break;
          __s[lVar13] = pcVar4[lVar13 + uVar9];
          lVar13 = lVar13 + 1;
        } while ((long)(int)uVar14 - uVar9 != lVar13);
      }
      cVar2 = *__s;
      dVar21 = 0.0;
      pcVar4 = __s;
      do {
        if (cVar2 == '\0') {
LAB_00130dcc:
          if (dVar21 <= 0.0) {
            bVar19 = false;
          }
          else {
            stopTime = get_time((time_t *)0x0);
            dVar20 = get_difftime(stopTime,0);
            bVar19 = dVar20 <= dVar21;
          }
          free(__s);
          return bVar19;
        }
        pcVar4 = pcVar4 + 1;
        if (9 < (byte)(cVar2 - 0x30U)) {
          dVar21 = 0.0;
          goto LAB_00130dcc;
        }
        dVar21 = dVar21 * 10.0 + (double)(int)(char)(cVar2 - 0x30U);
        cVar2 = *pcVar4;
      } while( true );
    }
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/sastoken.c"
                ,"SASToken_Validate",0xa3,1,"malloc error, size:%zu",__size);
      return false;
    }
  }
  return false;
}

Assistant:

bool SASToken_Validate(STRING_HANDLE sasToken)
{
    bool result;
    /*Codes_SRS_SASTOKEN_25_025: [**SASToken_Validate shall get the SASToken value by invoking STRING_c_str on the handle.**]***/
    const char* sasTokenArray = STRING_c_str(sasToken);

    /* Codes_SRS_SASTOKEN_25_024: [**If handle is NULL then SASToken_Validate shall return false.**] */
    /* Codes_SRS_SASTOKEN_25_026: [**If STRING_c_str on handle return NULL then SASToken_Validate shall return false.**] */
    if (sasToken == NULL || sasTokenArray == NULL)
    {
        result = false;
    }
    else
    {
        int seStart = -1, seStop = -1;
        int srStart = -1, srStop = -1;
        int sigStart = -1, sigStop = -1;
        int tokenLength = (int)STRING_length(sasToken);
        int i;
        for (i = 0; i < tokenLength; i++)
        {
            if (sasTokenArray[i] == 's' && sasTokenArray[i + 1] == 'e' && sasTokenArray[i + 2] == '=') // Look for se=
            {
                seStart = i + 3;
                if (srStart > 0 && srStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ') // look for either & or space
                        srStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        srStop = i - 2;
                    else
                        seStart = -1; // as the format is not either "&se=" or " se="
                }
                else if (sigStart > 0 && sigStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ')
                        sigStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        sigStop = i - 2;
                    else
                        seStart = -1;
                }
            }
            else if (sasTokenArray[i] == 's' && sasTokenArray[i + 1] == 'r' && sasTokenArray[i + 2] == '=') // Look for sr=
            {
                srStart = i + 3;
                if (seStart > 0 && seStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ')
                        seStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        seStop = i - 2;
                    else
                        srStart = -1;
                }
                else if (sigStart > 0 && sigStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ')
                        sigStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        sigStop = i - 2;
                    else
                        srStart = -1;
                }
            }
            else if (sasTokenArray[i] == 's' && sasTokenArray[i + 1] == 'i' && sasTokenArray[i + 2] == 'g' && sasTokenArray[i + 3] == '=') // Look for sig=
            {
                sigStart = i + 4;
                if (srStart > 0 && srStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ')
                        srStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        srStop = i - 2;
                    else
                        sigStart = -1;
                }
                else if (seStart > 0 && seStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ')
                        seStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        seStop = i - 2;
                    else
                        sigStart = -1;
                }
            }
        }

        /*Codes_SRS_SASTOKEN_25_027: [**If SASTOKEN does not obey the SASToken format then SASToken_Validate shall return false.**]***/
        /*Codes_SRS_SASTOKEN_25_028: [**SASToken_validate shall check for the presence of sr, se and sig from the token and return false if not found**]***/
        if (seStart < 0 || srStart < 0 || sigStart < 0)
        {
            result = false;
        }
        else
        {
            if (seStop < 0)
            {
                seStop = tokenLength;
            }
            else if (srStop < 0)
            {
                srStop = tokenLength;
            }
            else if (sigStop < 0)
            {
                sigStop = tokenLength;
            }

            if ((seStop <= seStart) ||
                (srStop <= srStart) ||
                (sigStop <= sigStart))
            {
                result = false;
            }
            else
            {
                char* expiryASCII;
                size_t malloc_size = safe_subtract_size_t((size_t)seStop, (size_t)seStart);
                malloc_size = safe_add_size_t(malloc_size, 1);
                /*Codes_SRS_SASTOKEN_25_031: [**If malloc fails during validation then SASToken_Validate shall return false.**]***/
                if (malloc_size == SIZE_MAX ||
                    (expiryASCII = (char*)malloc(malloc_size)) == NULL)
                {
                    LogError("malloc error, size:%zu", malloc_size);
                    result = false;
                }
                else
                {
                    double expiry;
                    // Add the Null terminator here
                    memset(expiryASCII, 0, (size_t)seStop - (size_t)seStart + 1);
                    for (i = seStart; i < seStop; i++)
                    {
                        // The se contains the expiration values, if a & token is encountered then
                        // the se field is complete.
                        if (sasTokenArray[i] == '&')
                        {
                            break;
                        }
                        expiryASCII[i - seStart] = sasTokenArray[i];
                    }
                    expiry = getExpiryValue(expiryASCII);
                    /*Codes_SRS_SASTOKEN_25_029: [**SASToken_validate shall check for expiry time from token and if token has expired then would return false **]***/
                    if (expiry <= 0)
                    {
                        result = false;
                    }
                    else
                    {
                        double secSinceEpoch = get_difftime(get_time(NULL), (time_t)0);
                        if (expiry < secSinceEpoch)
                        {
                            /*Codes_SRS_SASTOKEN_25_029: [**SASToken_validate shall check for expiry time from token and if token has expired then would return false **]***/
                            result = false;
                        }
                        else
                        {
                            /*Codes_SRS_SASTOKEN_25_030: [**SASToken_validate shall return true only if the format is obeyed and the token has not yet expired **]***/
                            result = true;
                        }
                    }
                    free(expiryASCII);
                }
            }
        }
    }

    return result;
}